

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaSelect(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Vec_Int_t *vLeaves)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  
  vLeaves->nSize = 0;
  if (0 < vCos->nSize) {
    lVar3 = 0;
    do {
      iVar2 = vCos->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_00569e4a;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = p->pObjs + iVar2;
      Bmc_MnaSelect_rec(p,pGVar1 + -(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff),vLeaves);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vCos->nSize);
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0x7fffffffffffffff;
  if (0 < vNodes->nSize) {
    lVar3 = 0;
    do {
      iVar2 = vNodes->pArray[lVar3];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_00569e4a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar1 = p->pObjs + iVar2;
      *(ulong *)pGVar1 = *(ulong *)pGVar1 & 0x7fffffffffffffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vNodes->nSize);
  }
  return;
}

Assistant:

void Bmc_MnaSelect( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Vec_Int_t * vLeaves )
{
    Gia_Obj_t * pObj;
    int i;
    Vec_IntClear( vLeaves );
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}